

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconvert_linux.c
# Opt level: O1

void CharConvSU(charconv *CC,char *Out,size_t OutLen,utf16_t *In)

{
  size_t sVar1;
  size_t sVar2;
  ushort uVar3;
  char *_Out;
  size_t _OutLen;
  size_t _InLen;
  char *_In;
  char *local_40;
  size_t local_38;
  size_t local_30;
  utf16_t *local_28;
  
  if (OutLen != 0) {
    local_28 = In;
    sVar1 = utf16len(In);
    local_30 = sVar1 + 1;
    local_40 = Out;
    local_38 = OutLen;
    if (((local_30 == 0 || CC == (charconv *)0x0) ||
        (sVar2 = iconv(CC,(char **)&local_28,&local_30,&local_40,&local_38),
        sVar2 == 0xffffffffffffffff)) ||
       (sVar2 = iconv(CC,(char **)0x0,(size_t *)0x0,&local_40,&local_38),
       sVar2 == 0xffffffffffffffff)) {
      if (OutLen != 1) {
        do {
          uVar3 = *In;
          if (uVar3 == 0) break;
          if (0xff < uVar3) {
            uVar3 = 0x2a;
          }
          *Out = (char)uVar3;
          In = In + 1;
          OutLen = OutLen - 1;
          Out = Out + 1;
        } while (1 < OutLen);
      }
      *Out = '\0';
      if ((CC != (charconv *)0x0) && (local_30 != 0)) {
        iconv(CC,(char **)0x0,(size_t *)0x0,(char **)0x0,(size_t *)0x0);
      }
    }
    else {
      *local_40 = '\0';
    }
  }
  return;
}

Assistant:

void CharConvSU(charconv* CC, char* Out, size_t OutLen, const utf16_t* In)
{
    if (OutLen>0)
    {
        ICONV_CONST char* _In = (ICONV_CONST char*)In;
        size_t _InLen = utf16len(In)+1;
        char* _Out = Out;
        size_t _OutLen = OutLen;

        if (!CC || !_InLen || iconv((iconv_t)CC, &_In, &_InLen, &_Out, &_OutLen) == (size_t)-1 ||
                    iconv((iconv_t)CC, NULL, NULL, &_Out, &_OutLen) == (size_t)-1)
        {
            for (;OutLen>1 && *In;++In,--OutLen,++Out)
                *Out = (char)(*In>255?'*':*In);
            *Out = 0;
            if (CC && _InLen) iconv((iconv_t)CC, NULL, NULL, NULL, NULL); // reset state
        }
        else
            *_Out=0;
    }
}